

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O0

void __thiscall ncnn::ConvolutionDepthWise1D::ConvolutionDepthWise1D(ConvolutionDepthWise1D *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__ConvolutionDepthWise1D_009f7b00;
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x20));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x2a));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x33));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

ConvolutionDepthWise1D::ConvolutionDepthWise1D()
{
    one_blob_only = true;
    support_inplace = false;
}